

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

QpSolverStatus __thiscall
CholeskyFactor::expand(CholeskyFactor *this,QpVector *yp,QpVector *gyp,QpVector *l,QpVector *m)

{
  reference pvVar1;
  long in_RCX;
  undefined8 in_RSI;
  CholeskyFactor *in_RDI;
  double dVar2;
  double dVar3;
  HighsInt i;
  double lambda;
  double mu;
  QpVector *in_stack_ffffffffffffff98;
  QpVector *in_stack_ffffffffffffffa0;
  value_type vVar4;
  int local_44;
  QpVector *in_stack_ffffffffffffffc0;
  HighsInt new_k_max;
  CholeskyFactor *this_00;
  QpSolverStatus local_4;
  
  new_k_max = (HighsInt)((ulong)in_RSI >> 0x20);
  if ((in_RDI->uptodate & 1U) == 0) {
    local_4 = OK;
  }
  else {
    this_00 = in_RDI;
    dVar2 = QpVector::operator*(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QpVector::resparsify((QpVector *)in_RDI);
    dVar3 = QpVector::norm2(in_stack_ffffffffffffffc0);
    dVar2 = dVar2 - dVar3;
    if (dVar2 <= 0.0) {
      local_4 = NOTPOSITIVDEFINITE;
    }
    else {
      if (in_RDI->current_k_max <= in_RDI->current_k + 1) {
        resize(this_00,new_k_max);
      }
      for (local_44 = 0; local_44 < in_RDI->current_k; local_44 = local_44 + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),
                            (long)local_44);
        vVar4 = *pvVar1;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->L,(long)(local_44 * in_RDI->current_k_max + in_RDI->current_k))
        ;
        *pvVar1 = vVar4;
      }
      dVar3 = sqrt(dVar2);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->L,
                          (long)(in_RDI->current_k * in_RDI->current_k_max + in_RDI->current_k));
      *pvVar1 = dVar3;
      in_RDI->current_k = in_RDI->current_k + 1;
      local_4 = OK;
    }
  }
  return local_4;
}

Assistant:

QpSolverStatus expand(const QpVector& yp, QpVector& gyp, QpVector& l,
                        QpVector& m) {
    if (!uptodate) {
      return QpSolverStatus::OK;
    }
    double mu = gyp * yp;
    l.resparsify();
    double lambda = mu - l.norm2();
    if (lambda > 0.0) {
      if (current_k_max <= current_k + 1) {
        resize(current_k_max * 2);
      }

      for (HighsInt i = 0; i < current_k; i++) {
        L[i * current_k_max + current_k] = l.value[i];
      }
      L[current_k * current_k_max + current_k] = sqrt(lambda);

      current_k++;
    } else {
      return QpSolverStatus::NOTPOSITIVDEFINITE;

      //     |LL' 0|
      // M = |0'  0| + bb' -aa'
      // a = (k * m, alpha), b = (k * m, beta)
      // b*b -a*a = mu
      // k(b-a) = 1
      // b + a = k*mu
      // Commented out unreachable code
      //      const double tolerance = 0.001;
      //
      //      double beta = max(tolerance, sqrt(m.norm2() / L[0] + fabs(mu)));
      //      double k = 1 / (beta + sqrt(beta * beta - mu));
      //      double alpha = k * mu - beta;
      //
      //      printf("k = %d, alpha = %lf, beta = %lf, k = %lf\n",
      //      (int)current_k, alpha,
      //             beta, k);
      //
      //      a.clear();
      //      a.resize(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        a[i] = k * m.value[i];
      //      }
      //      a[current_k] = alpha;
      //
      //      std::vector<double> b(current_k + 1);
      //      for (HighsInt i = 0; i < current_k; i++) {
      //        b[i] = k * m.value[i];
      //      }
      //      b[current_k] = beta;
      //
      //      if (current_k_max <= current_k + 1) {
      //        resize(current_k_max * 2);
      //      }
      //
      //      // append b to the left of L
      //      for (HighsInt row = current_k; row > 0; row--) {
      //        // move row one position down
      //        for (HighsInt i = 0; i < current_k; i++) {
      //          L[row * current_k_max + i] = L[(row - 1) * current_k_max + i];
      //        }
      //      }
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        L[i] = b[i];
      //      }
      //
      //      // re-triangulize
      //      for (HighsInt i = 0; i < current_k + 1; i++) {
      //        eliminate(L, i, i + 1, current_k_max, current_k + 1);
      //      }
      //
      //      current_k = current_k + 1;
    }
    return QpSolverStatus::OK;
  }